

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_compress.c
# Opt level: O0

void heapify_subtree(u32 *A,uint length,uint subtree_idx)

{
  uint uVar1;
  u32 v;
  uint child_idx;
  uint parent_idx;
  uint subtree_idx_local;
  uint length_local;
  u32 *A_local;
  
  uVar1 = A[subtree_idx];
  parent_idx = subtree_idx;
  while (child_idx = parent_idx * 2, child_idx <= length) {
    if ((child_idx < length) && (A[child_idx] < A[child_idx + 1])) {
      child_idx = child_idx + 1;
    }
    if (A[child_idx] <= uVar1) break;
    A[parent_idx] = A[child_idx];
    parent_idx = child_idx;
  }
  A[parent_idx] = uVar1;
  return;
}

Assistant:

void
heapify_subtree(u32 A[], unsigned length, unsigned subtree_idx)
{
	unsigned parent_idx;
	unsigned child_idx;
	u32 v;

	v = A[subtree_idx];
	parent_idx = subtree_idx;
	while ((child_idx = parent_idx * 2) <= length) {
		if (child_idx < length && A[child_idx + 1] > A[child_idx])
			child_idx++;
		if (v >= A[child_idx])
			break;
		A[parent_idx] = A[child_idx];
		parent_idx = child_idx;
	}
	A[parent_idx] = v;
}